

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_3UL>_> *this,double t,array<float,_3UL> *v)

{
  pointer *ppSVar1;
  iterator __position;
  undefined4 uVar2;
  Sample s;
  Sample local_20;
  
  uVar2 = local_20._20_4_;
  local_20._20_4_ = local_20._20_4_ & 0xffffff00;
  local_20.value._M_elems[2] = v->_M_elems[2];
  local_20.value._M_elems._0_8_ = *(undefined8 *)v->_M_elems;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)(((__position._M_current)->value)._M_elems + 2) =
         CONCAT44(uVar2,local_20.value._M_elems[2]) & 0xffffff00ffffffff;
    (__position._M_current)->t = t;
    *(undefined8 *)((__position._M_current)->value)._M_elems = local_20.value._M_elems._0_8_;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }